

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::CumulativeReporterBase::SectionNode::SectionNode(SectionNode *this,SectionStats *_stats)

{
  (this->super_SharedImpl<Catch::IShared>).m_rc = 0;
  (this->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable =
       (_func_int **)&PTR__SectionNode_0015d780;
  SectionStats::SectionStats(&this->stats,_stats);
  (this->assertions).
  super__Vector_base<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->assertions).
  super__Vector_base<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->childSections).
  super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->assertions).
  super__Vector_base<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->childSections).
  super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->childSections).
  super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->stdOut)._M_dataplus._M_p = (pointer)&(this->stdOut).field_2;
  (this->stdOut)._M_string_length = 0;
  (this->stdOut).field_2._M_local_buf[0] = '\0';
  (this->stdErr)._M_dataplus._M_p = (pointer)&(this->stdErr).field_2;
  (this->stdErr)._M_string_length = 0;
  (this->stdErr).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

explicit SectionNode( SectionStats const& _stats ) : stats( _stats ) {}